

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit<ritobin::Vec4>
          (BinBinaryReader *this,Vec4 *value)

{
  char **ppcVar1;
  char *pos;
  char *pcVar2;
  undefined8 uVar3;
  byte in_AL;
  
  pos = (this->reader).cur_;
  pcVar2 = (this->reader).cap_;
  if (pcVar2 < pos + 0x10) {
    in_AL = fail_msg(this,"reader.read(value.value)",pos);
  }
  else {
    uVar3 = *(undefined8 *)(pos + 8);
    *(undefined8 *)(value->value)._M_elems = *(undefined8 *)pos;
    *(undefined8 *)((value->value)._M_elems + 2) = uVar3;
    ppcVar1 = &(this->reader).cur_;
    *ppcVar1 = *ppcVar1 + 0x10;
  }
  return (bool)(pos + 0x10 <= pcVar2 | in_AL & 1);
}

Assistant:

bool read(std::array<T, SIZE>& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            if (cur_ + sizeof(T) * SIZE > cap_) {
                return false;
            }
            memcpy(value.data(), cur_, sizeof(T) * SIZE);
            cur_ += sizeof(T) * SIZE;
            return true;
        }